

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_mult.cpp
# Opt level: O1

void mult_test(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Multiplication tests completed",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void mult_test()
{
	try
	{
		mult_test_uint64_uint64();
		mult_test_uint64_uint32();
		mult_test_uint64_int64();
		mult_test_uint64_int32();

		mult_test_int64_uint64();
		mult_test_int64_uint32();
		mult_test_int64_int64();
		mult_test_int64_int32();

		mult_test_uint32_uint64();
		mult_test_uint32_uint32();
		mult_test_uint32_int64();
		mult_test_uint32_int32();

		mult_test_int32_uint64();
		mult_test_int32_uint32();
		mult_test_int32_int64();
		mult_test_int32_int32();

		std::cout << "Multiplication tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Multiplication tests failed - " << err.what() << std::endl;
	}

	return;
}